

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

void __thiscall Widget::writeXmlChildren(Widget *this,stringstream *str,int indent)

{
  pointer ppWVar1;
  Widget *pWVar2;
  ostream *poVar3;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  undefined8 extraout_RDX_00;
  ostream *poVar5;
  int i;
  ulong uVar6;
  string local_50;
  
  poVar5 = (ostream *)(str + 0x10);
  Util::getIndent_abi_cxx11_(&local_50,(Util *)(ulong)(uint)indent,indent);
  poVar3 = std::operator<<(poVar5,(string *)&local_50);
  poVar3 = std::operator<<(poVar3,"<Widgets>");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_50);
  uVar6 = 0;
  uVar4 = extraout_RDX;
  while( true ) {
    ppWVar1 = (this->children).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->children).super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppWVar1 >> 3) <= uVar6)
    break;
    pWVar2 = ppWVar1[uVar6];
    (**pWVar2->_vptr_Widget)(&local_50,pWVar2,(ulong)(indent + 1));
    poVar3 = std::operator<<(poVar5,(string *)&local_50);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_50);
    uVar6 = uVar6 + 1;
    uVar4 = extraout_RDX_00;
  }
  Util::getIndent_abi_cxx11_(&local_50,(Util *)(ulong)(uint)indent,(int)uVar4);
  poVar3 = std::operator<<(poVar5,(string *)&local_50);
  poVar3 = std::operator<<(poVar3,"</Widgets>");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void Widget::writeXmlChildren(std::stringstream& str, int indent) const
{
	str << Util::getIndent(indent) << "<Widgets>" << std::endl;
	for (int i = 0; i < children.size(); i++)
	{
		str << children[i]->writeXml(indent + 1) << std::endl;
	}
	str << Util::getIndent(indent) << "</Widgets>" << std::endl;
}